

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadBitM_Ascii
          (COBImporter *this,Scene *param_1,LineSplitter *splitter,ChunkInfo *nfo)

{
  char cVar1;
  LineSplitter *pLVar2;
  char *pcVar3;
  Logger *this_00;
  range_error *this_01;
  int iVar5;
  ulong uVar6;
  char *pcVar4;
  
  if (1 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"BitM");
    return;
  }
  pLVar2 = LineSplitter::operator++(splitter);
  pcVar4 = (pLVar2->mCur)._M_dataplus._M_p;
  do {
    do {
      pcVar3 = pcVar4 + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar3;
    } while (cVar1 == '\t');
  } while (cVar1 == ' ');
  do {
    uVar6 = (ulong)(byte)pcVar3[-1];
    if (uVar6 < 0x21) {
      if ((0x100000200U >> (uVar6 & 0x3f) & 1) != 0) {
        for (; (cVar1 = pcVar3[-1], cVar1 == ' ' || (cVar1 == '\t')); pcVar3 = pcVar3 + 1) {
        }
        if (0xf5 < (byte)(cVar1 - 0x3aU)) {
          iVar5 = 0;
          do {
            iVar5 = (uint)(byte)(cVar1 - 0x30) + iVar5 * 10;
            cVar1 = *pcVar3;
            pcVar3 = pcVar3 + 1;
          } while (0xf5 < (byte)(cVar1 - 0x3aU));
          if (iVar5 == 1) {
            return;
          }
        }
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"Unexpected ThumbNailHdrSize, skipping this chunk");
        return;
      }
      if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
        this_01 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_01,"Token index out of range, EOL reached");
        __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
      }
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void COBImporter::ReadBitM_Ascii(Scene& /*out*/, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Ascii(splitter,nfo,"BitM");
    }
/*
    "\nThumbNailHdrSize %ld"
    "\nThumbHeader: %02hx 02hx %02hx "
    "\nColorBufSize %ld"
    "\nColorBufZipSize %ld"
    "\nZippedThumbnail: %02hx 02hx %02hx "
*/

    const unsigned int head = strtoul10((++splitter)[1]);
    if (head != sizeof(Bitmap::BitmapHeader)) {
        ASSIMP_LOG_WARN("Unexpected ThumbNailHdrSize, skipping this chunk");
        return;
    }

    /*union {
        Bitmap::BitmapHeader data;
        char opaq[sizeof Bitmap::BitmapHeader()];
    };*/
//  ReadHexOctets(opaq,head,(++splitter)[1]);
}